

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv__close(int fd)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  if (fd < 0) {
    __assert_fail("fd > -1","src/unix/core.c",0x1a0,"int uv__close(int)");
  }
  if (2 < (uint)fd) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    iVar2 = close(fd);
    if (iVar2 == -1) {
      iVar2 = -0x73;
      if (*piVar3 != 4) {
        iVar2 = -*piVar3;
      }
      *piVar3 = iVar1;
    }
    return iVar2;
  }
  __assert_fail("fd > STDERR_FILENO","src/unix/core.c",0x1a1,"int uv__close(int)");
}

Assistant:

int uv__close(int fd) {
  int saved_errno;
  int rc;

  assert(fd > -1);  /* Catch uninitialized io_watcher.fd bugs. */
  assert(fd > STDERR_FILENO);  /* Catch stdio close bugs. */

  saved_errno = errno;
  rc = close(fd);
  if (rc == -1) {
    rc = -errno;
    if (rc == -EINTR)
      rc = -EINPROGRESS;  /* For platform/libc consistency. */
    errno = saved_errno;
  }

  return rc;
}